

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O3

uint ON_GetVersionString(uint major_version,uint minor_version,uint year,uint month,
                        uint day_of_month,uint hour,uint minute,uint branch,
                        size_t string_buffer_capacity,char *string_buffer)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  unsigned_short quartet_values [4];
  char local_48 [24];
  
  quartet_values[0] = 0;
  quartet_values[1] = 0;
  quartet_values[2] = 0;
  quartet_values[3] = 0;
  uVar3 = ON_GetVersionQuartet
                    (major_version,minor_version,year,month,day_of_month,hour,minute,branch,
                     quartet_values);
  pcVar5 = local_48;
  if (string_buffer != (char *)0x0 && string_buffer_capacity != 0) {
    pcVar5 = string_buffer;
  }
  uVar7 = 0x18;
  if (string_buffer != (char *)0x0 && string_buffer_capacity != 0) {
    uVar7 = string_buffer_capacity;
  }
  uVar6 = 0;
  if (uVar3 != 0) {
    uVar4 = 0;
    uVar10 = 0;
    uVar3 = 0;
    do {
      uVar11 = uVar3;
      if (uVar4 != 0) {
        uVar11 = uVar3 + 1;
        pcVar5[uVar10] = '.';
      }
      uVar10 = (ulong)uVar11;
      if (uVar7 == uVar10) {
        uVar6 = 0;
        goto LAB_00663fcd;
      }
      uVar1 = quartet_values[uVar4];
      uVar3 = (uint)uVar1;
      iVar9 = 0;
      do {
        iVar8 = iVar9;
        iVar9 = iVar8 + -1;
        bVar2 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
      uVar6 = 0;
      if (uVar7 - uVar10 <= (ulong)(uint)-iVar9) goto LAB_00663fcd;
      pcVar5[(uint)-iVar9 + uVar10] = '\0';
      uVar12 = -iVar8;
      uVar3 = (uint)uVar1;
      do {
        pcVar5[uVar12 + uVar10] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
        uVar12 = uVar12 - 1;
        bVar2 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
      if (iVar9 == 0) goto LAB_00663fcd;
      if (2 < uVar4) break;
      uVar3 = uVar11 - iVar9;
      uVar10 = (ulong)uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar10 < uVar7);
    uVar6 = uVar11 - iVar9;
  }
LAB_00663fcd:
  uVar11 = 0;
  uVar3 = 0;
  if (uVar6 <= uVar7) {
    uVar11 = uVar6;
    uVar3 = uVar6;
  }
  for (; uVar11 < uVar7; uVar11 = uVar11 + 1) {
    pcVar5[uVar11] = '\0';
  }
  return uVar3;
}

Assistant:

unsigned int ON_GetVersionString(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  size_t string_buffer_capacity,
  char* string_buffer
  )
{
  char s[24] = {0};
  const size_t s_capacity = sizeof(s)/sizeof(s[0]);
  unsigned int string_length = 0;
  unsigned int i, j;
  unsigned short quartet_values[4] = {0};
  unsigned int version_number = ON_GetVersionQuartet(
                                      major_version,
                                      minor_version,
                                      year,
                                      month,
                                      day_of_month,
                                      hour,
                                      minute,
                                      branch,
                                      quartet_values
                                      );

  if (string_buffer_capacity <= 0 || nullptr == string_buffer)
  {
    string_buffer_capacity = s_capacity;
    string_buffer = s;
  }

  if ( version_number > 0 )
  {
    for(i = 0; i < 4 && string_length < string_buffer_capacity; i++ )
    {
      if ( i > 0 )
        string_buffer[string_length++] = '.';

      j = AppendValueToString(
        quartet_values[i],
        string_buffer_capacity - string_length,
        string_buffer + string_length
        );

      if ( j <= 0 )
      {
        string_length = 0;
        break;
      }

      string_length += j;

    }
  }

  if ( string_length > string_buffer_capacity )
    string_length = 0;

  for ( i = string_length; i < string_buffer_capacity; i++ )
    string_buffer[i] = 0;

  return string_length;
}